

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O1

ProStringList * __thiscall
QMap<ProString,_ProStringList>::operator[](QMap<ProString,_ProStringList> *this,ProString *key)

{
  QMapData<std::map<ProString,_ProStringList,_std::less<ProString>,_std::allocator<std::pair<const_ProString,_ProStringList>_>_>_>
  *pQVar1;
  iterator iVar2;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_ProString,_ProStringList>_>,_bool> pVar3;
  QMap<ProString,_ProStringList> copy;
  QArrayDataPointer<ProString> local_98;
  pair<const_ProString,_ProStringList> local_78;
  QExplicitlySharedDataPointerV2<QMapData<std::map<ProString,_ProStringList,_std::less<ProString>,_std::allocator<std::pair<const_ProString,_ProStringList>_>_>_>_>
  local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->d).d.ptr;
  if ((pQVar1 == (QMapData<std::map<ProString,_ProStringList,_std::less<ProString>,_std::allocator<std::pair<const_ProString,_ProStringList>_>_>_>
                  *)0x0) ||
     ((__atomic_base<int>)
      *(__int_type *)
       &(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value == (__atomic_base<int>)0x1)) {
    local_30.d.ptr =
         (totally_ordered_wrapper<QMapData<std::map<ProString,_ProStringList,_std::less<ProString>,_std::allocator<std::pair<const_ProString,_ProStringList>_>_>_>_*>
          )(QMapData<std::map<ProString,_ProStringList,_std::less<ProString>,_std::allocator<std::pair<const_ProString,_ProStringList>_>_>_>
            *)0x0;
  }
  else {
    local_30.d.ptr =
         (totally_ordered_wrapper<QMapData<std::map<ProString,_ProStringList,_std::less<ProString>,_std::allocator<std::pair<const_ProString,_ProStringList>_>_>_>_*>
          )(this->d).d.ptr;
    if (local_30.d.ptr !=
        (QMapData<std::map<ProString,_ProStringList,_std::less<ProString>,_std::allocator<std::pair<const_ProString,_ProStringList>_>_>_>
         *)0x0) {
      LOCK();
      (((QMapData<std::map<ProString,_ProStringList,_std::less<ProString>,_std::allocator<std::pair<const_ProString,_ProStringList>_>_>_>
         *)local_30.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value =
           (Type)((int)(((QMapData<std::map<ProString,_ProStringList,_std::less<ProString>,_std::allocator<std::pair<const_ProString,_ProStringList>_>_>_>
                          *)local_30.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
                       super_QBasicAtomicInteger<int>._q_value + 1);
      UNLOCK();
    }
  }
  detach(this);
  iVar2 = std::
          _Rb_tree<ProString,_std::pair<const_ProString,_ProStringList>,_std::_Select1st<std::pair<const_ProString,_ProStringList>_>,_std::less<ProString>,_std::allocator<std::pair<const_ProString,_ProStringList>_>_>
          ::find(&(((this->d).d.ptr)->m)._M_t,key);
  pQVar1 = (this->d).d.ptr;
  if ((_Rb_tree_header *)iVar2._M_node == &(pQVar1->m)._M_t._M_impl.super__Rb_tree_header) {
    local_98.size = 0;
    local_98.d = (Data *)0x0;
    local_98.ptr = (ProString *)0x0;
    ProString::ProString(&local_78.first,key);
    local_78.second.super_QList<ProString>.d.size = local_98.size;
    local_78.second.super_QList<ProString>.d.ptr = local_98.ptr;
    local_78.second.super_QList<ProString>.d.d = local_98.d;
    local_98.d = (Data *)0x0;
    local_98.ptr = (ProString *)0x0;
    local_98.size = 0;
    pVar3 = std::
            _Rb_tree<ProString,std::pair<ProString_const,ProStringList>,std::_Select1st<std::pair<ProString_const,ProStringList>>,std::less<ProString>,std::allocator<std::pair<ProString_const,ProStringList>>>
            ::_M_insert_unique<std::pair<ProString_const,ProStringList>>
                      ((_Rb_tree<ProString,std::pair<ProString_const,ProStringList>,std::_Select1st<std::pair<ProString_const,ProStringList>>,std::less<ProString>,std::allocator<std::pair<ProString_const,ProStringList>>>
                        *)&pQVar1->m,&local_78);
    iVar2._M_node = (_Base_ptr)pVar3.first._M_node;
    QArrayDataPointer<ProString>::~QArrayDataPointer
              ((QArrayDataPointer<ProString> *)&local_78.second);
    if (&(local_78.first.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.first.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           = ((local_78.first.m_string.d.d)->super_QArrayData).ref_._q_value.
             super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.first.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
          _M_i == 0) {
        QArrayData::deallocate(&(local_78.first.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    QArrayDataPointer<ProString>::~QArrayDataPointer(&local_98);
  }
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<ProString,_ProStringList,_std::less<ProString>,_std::allocator<std::pair<const_ProString,_ProStringList>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (ProStringList *)&iVar2._M_node[2]._M_left;
  }
  __stack_chk_fail();
}

Assistant:

T &operator[](const Key &key)
    {
        const auto copy = d.isShared() ? *this : QMap(); // keep `key` alive across the detach
        detach();
        auto i = d->m.find(key);
        if (i == d->m.end())
            i = d->m.insert({key, T()}).first;
        return i->second;
    }